

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O0

uint __thiscall
dg::BBlock<dg::LLVMNode>::removeSuccessorsTarget
          (BBlock<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *target)

{
  BBlockEdge n;
  bool bVar1;
  iterator iVar2;
  BBlock<dg::LLVMNode> *pBVar3;
  KeyT in_RSI;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *in_RDI;
  BBlockEdge *edge;
  iterator __end0;
  iterator __begin0;
  SuccContainerT *__range2;
  SuccContainerT tmp;
  uint removed;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  _Self local_58;
  size_t *local_50;
  uint local_14;
  KeyT local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::DGContainer
            ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x1d2973);
  local_50 = &(in_RDI->container)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_58._M_node =
       (_Base_ptr)
       DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                 ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  iVar2 = DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                    ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while( true ) {
    bVar1 = std::operator!=(&local_58,(_Self *)&stack0xffffffffffffffa0);
    if (!bVar1) break;
    pBVar3 = (BBlock<dg::LLVMNode> *)
             std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                       ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1d29be);
    if (pBVar3->key == local_10) {
      local_14 = local_14 + 1;
    }
    else {
      n._8_8_ = iVar2._M_node;
      n.target = pBVar3;
      DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::insert
                ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)pBVar3->dg,n);
    }
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)in_RDI);
  }
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::swap
            (in_RDI,(DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::~DGContainer
            ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x1d2a3c);
  return local_14;
}

Assistant:

unsigned removeSuccessorsTarget(BBlock<NodeT> *target) {
        unsigned removed = 0;
        SuccContainerT tmp;
        // approx
        for (auto &edge : nextBBs) {
            if (edge.target != target)
                tmp.insert(edge);
            else
                ++removed;
        }

        nextBBs.swap(tmp);
        return removed;
    }